

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<bssl::(anonymous_namespace)::TrustStoreInMemoryTest_OneRootTrusted_Test>::CreateTest
          (TestFactoryImpl<bssl::(anonymous_namespace)::TrustStoreInMemoryTest_OneRootTrusted_Test>
           *this)

{
  TrustStoreInMemoryTest *this_00;
  
  this_00 = (TrustStoreInMemoryTest *)operator_new(0x70);
  bssl::anon_unknown_0::TrustStoreInMemoryTest::TrustStoreInMemoryTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__TrustStoreInMemoryTest_005b21f8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }